

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

bool __thiscall helics::TimeCoordinator::addDependent(TimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  value_type local_34;
  handle local_30;
  
  local_34.gid = fedID.gid;
  bVar1 = BaseTimeCoordinator::addDependent(&this->super_BaseTimeCoordinator,fedID);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::lock(&local_30,&this->dependent_federates);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
              (local_30.data,&local_34);
    std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  }
  return bVar1;
}

Assistant:

bool TimeCoordinator::addDependent(GlobalFederateId fedID)
{
    if (BaseTimeCoordinator::addDependent(fedID)) {
        dependent_federates.lock()->push_back(fedID);
        return true;
    }
    return false;
}